

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delay.c
# Opt level: O0

int delay_segment_set(uint32_t field,void *value,mixed_segment *segment)

{
  void *pvVar1;
  double dVar2;
  delay_segment_data *data;
  mixed_segment *segment_local;
  void *value_local;
  uint32_t field_local;
  
  pvVar1 = segment->data;
  if (field == 1) {
    if ((*value & 1) == 0) {
      segment->mix = delay_segment_mix;
    }
    else {
      segment->mix = delay_segment_mix_bypass;
    }
  }
  else if (field == 2) {
    if (*value == 0) {
      mixed_err(8);
      return 0;
    }
    *(undefined4 *)((long)pvVar1 + 0x34) = *value;
    dVar2 = ceil((double)((float)*(uint *)((long)pvVar1 + 0x34) * *(float *)((long)pvVar1 + 0x30)));
    mixed_buffer_resize((uint32_t)(long)dVar2,(mixed_buffer *)((long)pvVar1 + 0x10));
  }
  else {
    if (field != 0x16) {
      mixed_err(7);
      return 0;
    }
    if (*value < 0.0) {
      mixed_err(8);
      return 0;
    }
    *(undefined4 *)((long)pvVar1 + 0x30) = *value;
    dVar2 = ceil((double)((float)*(uint *)((long)pvVar1 + 0x34) * *(float *)((long)pvVar1 + 0x30)));
    mixed_buffer_resize((uint32_t)(long)dVar2,(mixed_buffer *)((long)pvVar1 + 0x10));
  }
  return 1;
}

Assistant:

int delay_segment_set(uint32_t field, void *value, struct mixed_segment *segment){
  struct delay_segment_data *data = (struct delay_segment_data *)segment->data;
  switch(field){
  case MIXED_SAMPLERATE:
    if(*(uint32_t *)value <= 0){
      mixed_err(MIXED_INVALID_VALUE);
      return 0;
    }
    data->samplerate = *(uint32_t *)value;
    mixed_buffer_resize(ceil(data->samplerate * data->time), &data->buffer);
    break;
  case MIXED_DELAY_TIME:
    if(*(float *)value < 0.0){
      mixed_err(MIXED_INVALID_VALUE);
      return 0;
    }
    data->time = *(float *)value;
    mixed_buffer_resize(ceil(data->samplerate * data->time), &data->buffer);
    break;
  case MIXED_BYPASS:
    if(*(bool *)value){
      segment->mix = delay_segment_mix_bypass;
    }else{
      segment->mix = delay_segment_mix;
    }
    break;
  default:
    mixed_err(MIXED_INVALID_FIELD);
    return 0;
  }
  return 1;
}